

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trianglemesh.hpp
# Opt level: O1

vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> * __thiscall
TriangleMesh::loadfromfile
          (vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *__return_storage_ptr__,
          TriangleMesh *this,char *filename)

{
  undefined4 uVar1;
  iterator __position;
  undefined8 uVar2;
  vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *pvVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  size_t sVar7;
  istream *piVar8;
  Triangle *this_00;
  undefined8 *puVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  vec3f t;
  vec2f local_500;
  data_t local_4f8;
  vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *local_4f0;
  int indices [3];
  vector<vec2f,_std::allocator<vec2f>_> vt;
  vector<vec3f,_std::allocator<vec3f>_> vn;
  vector<vec3f,_std::allocator<vec3f>_> v;
  vector<vec2f,_std::allocator<vec2f>_> vvt;
  vector<vec3f,_std::allocator<vec3f>_> vvn;
  string cmd;
  string line;
  char *filename_local;
  stringstream in;
  byte abStack_3a0 [96];
  ios_base local_340 [264];
  ifstream fin;
  byte abStack_218 [488];
  
  local_4f0 = (vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)__return_storage_ptr__;
  filename_local = filename;
  github111116::ConsoleLogger::log<char[14],char_const*>
            (&console,(char (*) [14])"Loading mesh:",&filename_local);
  pcVar4 = filename_local;
  sVar7 = strlen(filename_local);
  iVar6 = strcmp(pcVar4 + (sVar7 - 4),".obj");
  if (iVar6 != 0) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = "format must be obj";
    __cxa_throw(puVar9,&char_const*::typeinfo,0);
  }
  std::ifstream::ifstream(&fin,pcVar4,_S_in);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) != 0) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = "Can\'t open file";
    __cxa_throw(puVar9,&char_const*::typeinfo,0);
  }
  *(undefined8 *)local_4f0 = 0;
  *(pointer *)(local_4f0 + 8) = (pointer)0x0;
  *(pointer *)(local_4f0 + 0x10) = (pointer)0x0;
  v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    do {
      cVar5 = std::ios::widen((char)*(undefined8 *)(_fin + -0x18) + (char)(istream *)&fin);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fin,(string *)&line,cVar5);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != &line.field_2) {
          operator_delete(line._M_dataplus._M_p);
        }
        pvVar3 = local_4f0;
        if (vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::ifstream::~ifstream(&fin);
        return (vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)pvVar3;
      }
      iVar6 = isalpha((int)*line._M_dataplus._M_p);
    } while (iVar6 == 0);
    std::__cxx11::stringstream::stringstream((stringstream *)&in,(string *)&line,_S_out|_S_in);
    cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
    cmd._M_string_length = 0;
    cmd.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&in,(string *)&cmd);
    iVar6 = std::__cxx11::string::compare((char *)&cmd);
    if (iVar6 == 0) {
      t.x = 0.0;
      t.y = 0.0;
      stack0xfffffffffffffaf0 = (undefined8 *)((ulong)stack0xfffffffffffffaf0 & 0xffffffff00000000);
      operator>>((istream *)&in,&t);
      if (v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<vec3f,std::allocator<vec3f>>::_M_realloc_insert<vec3f_const&>
                  ((vector<vec3f,std::allocator<vec3f>> *)&v,
                   (iterator)
                   v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                   super__Vector_impl_data._M_finish,&t);
      }
      else {
        (v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish)->z = t.z;
        (v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish)->x = t.x;
        (v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish)->y = t.y;
        v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish = v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    iVar6 = std::__cxx11::string::compare((char *)&cmd);
    if (iVar6 == 0) {
      t.x = 0.0;
      t.y = 0.0;
      operator>>((istream *)&in,(vec2f *)&t);
      if (vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<vec2f,std::allocator<vec2f>>::_M_realloc_insert<vec2f_const&>
                  ((vector<vec2f,std::allocator<vec2f>> *)&vt,
                   (iterator)
                   vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                   super__Vector_impl_data._M_finish,(vec2f *)&t);
      }
      else {
        (vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
        _M_finish)->x = t.x;
        (vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
        _M_finish)->y = t.y;
        vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
        _M_finish = vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    iVar6 = std::__cxx11::string::compare((char *)&cmd);
    if (iVar6 == 0) {
      t.x = 0.0;
      t.y = 0.0;
      stack0xfffffffffffffaf0 = (undefined8 *)((ulong)stack0xfffffffffffffaf0 & 0xffffffff00000000);
      operator>>((istream *)&in,&t);
      if (vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<vec3f,std::allocator<vec3f>>::_M_realloc_insert<vec3f_const&>
                  ((vector<vec3f,std::allocator<vec3f>> *)&vn,
                   (iterator)
                   vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                   super__Vector_impl_data._M_finish,&t);
      }
      else {
        (vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish)->z = t.z;
        (vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish)->x = t.x;
        (vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish)->y = t.y;
        vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish = vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    iVar6 = std::__cxx11::string::compare((char *)&cmd);
    if (iVar6 == 0) {
      t.x = 0.0;
      t.y = 0.0;
      stack0xfffffffffffffaf0 = (undefined8 *)0x0;
      bVar10 = false;
      vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      if ((abStack_3a0[*(long *)(_in + -0x18)] & 7) == 0) {
        bVar10 = false;
        do {
          indices[2] = 0;
          indices[0] = 0;
          indices[1] = 0;
          lVar12 = 0;
          do {
            iVar6 = std::istream::peek();
            if (iVar6 != 0x2f) {
              std::istream::operator>>((istream *)&in,(int *)((long)indices + lVar12));
            }
            iVar6 = std::istream::peek();
            if (iVar6 != 0x2f) break;
            std::istream::get();
            lVar12 = lVar12 + 4;
          } while (lVar12 != 0xc);
          while( true ) {
            iVar6 = std::istream::peek();
            iVar6 = isspace(iVar6);
            if (iVar6 == 0) break;
            std::istream::get();
          }
          if (indices[0] == 0) {
            github111116::ConsoleLogger::log<char[10],std::__cxx11::string>
                      (&console,(char (*) [10])"Obj line:",&line);
            puVar9 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar9 = "error parsing obj";
            __cxa_throw(puVar9,&char_const*::typeinfo,0);
          }
          iVar6 = indices[0];
          if (indices[0] < 0) {
            iVar6 = indices[0] +
                    (int)((ulong)((long)v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 2) * -0x55555555 + 1;
          }
          iVar11 = indices[1];
          if ((long)indices._0_8_ < 0) {
            iVar11 = indices[1] +
                     (int)((ulong)((long)vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl
                                        .super__Vector_impl_data._M_start) >> 3) + 1;
          }
          iVar13 = indices[2];
          if (indices[2] < 0) {
            iVar13 = indices[2] +
                     (int)((ulong)((long)vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl
                                        .super__Vector_impl_data._M_start) >> 2) * -0x55555555 + 1;
          }
          if (stack0xfffffffffffffaf0 == (undefined8 *)0x0) {
            std::vector<vec3f,std::allocator<vec3f>>::_M_realloc_insert<vec3f_const&>
                      ((vector<vec3f,std::allocator<vec3f>> *)&t,(iterator)0x0,
                       v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                       super__Vector_impl_data._M_start + (long)iVar6 + -1);
          }
          else {
            *(data_t *)(stack0xfffffffffffffaf0 + 1) =
                 v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data
                 ._M_start[(long)iVar6 + -1].z;
            *stack0xfffffffffffffaf0 =
                 *(undefined8 *)
                  (v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)iVar6 + -1);
            unique0x00006b80 = (undefined8 *)((long)stack0xfffffffffffffaf0 + 0xc);
          }
          if (iVar11 == 0) {
            local_500.x = 0.0;
            local_500.y = 0.0;
          }
          else {
            local_500 = vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)iVar11 + -1];
          }
          if (vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<vec2f,_std::allocator<vec2f>_>::_M_realloc_insert<vec2f>
                      (&vvt,(iterator)
                            vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                            super__Vector_impl_data._M_finish,&local_500);
          }
          else {
            *vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_500;
            vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
            _M_finish = vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if (iVar13 == 0) {
            local_500.x = 0.0;
            local_500.y = 1.0;
            local_4f8 = 0.0;
          }
          else {
            local_500.x = vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)iVar13 + -1].x;
            local_500.y = vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)iVar13 + -1].y;
            local_4f8 = vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)iVar13 + -1].z;
          }
          if (vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<vec3f,_std::allocator<vec3f>_>::_M_realloc_insert<vec3f>
                      (&vvn,(iterator)
                            vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                            super__Vector_impl_data._M_finish,(vec3f *)&local_500);
          }
          else {
            (vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_finish)->z = local_4f8;
            (vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_finish)->x = local_500.x;
            (vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_finish)->y = local_500.y;
            vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_finish = vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          bVar10 = (bool)(bVar10 | iVar13 == 0);
        } while ((abStack_3a0[*(long *)(_in + -0x18)] & 7) == 0);
      }
      uVar2 = t._0_8_;
      if ((long)stack0xfffffffffffffaf0 - t._0_8_ != 0x24) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar9 = "mesh face other than triangle not supported";
        __cxa_throw(puVar9,&char_const*::typeinfo,0);
      }
      fVar14 = *(float *)(t._0_8_ + 0x10) - *(float *)(t._0_8_ + 4);
      fVar16 = *(float *)(t._0_8_ + 0x14) - *(float *)(t._0_8_ + 8);
      fVar15 = *(float *)(t._0_8_ + 0x1c) - *(float *)(t._0_8_ + 4);
      fVar17 = *(float *)(t._0_8_ + 0x20) - *(float *)(t._0_8_ + 8);
      fVar18 = fVar14 * fVar17 - fVar15 * fVar16;
      if ((fVar18 != 0.0) || (NAN(fVar18))) {
LAB_00175bbb:
        this_00 = (Triangle *)operator_new(0xa0);
        Triangle::Triangle(this_00,*(vec3f *)uVar2,*(vec3f *)(uVar2 + 0xc),*(vec3f *)(uVar2 + 0x18),
                           *vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                            super__Vector_impl_data._M_start,
                           vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                           super__Vector_impl_data._M_start[1],
                           vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                           super__Vector_impl_data._M_start[2],
                           *vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                            super__Vector_impl_data._M_start,
                           vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                           super__Vector_impl_data._M_start[1],
                           vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                           super__Vector_impl_data._M_start[2]);
        __position._M_current = *(BasicPrimitive ***)(local_4f0 + 8);
        indices._0_8_ = this_00;
        if (__position._M_current == *(BasicPrimitive ***)(local_4f0 + 0x10)) {
          std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
          _M_realloc_insert<BasicPrimitive*>(local_4f0,__position,(BasicPrimitive **)indices);
        }
        else {
          *__position._M_current = (BasicPrimitive *)this_00;
          *(long *)(local_4f0 + 8) = *(long *)(local_4f0 + 8) + 8;
        }
        if (bVar10) {
          lVar12 = __dynamic_cast((*(pointer *)(local_4f0 + 8))[-1],&BasicPrimitive::typeinfo,
                                  &Triangle::typeinfo,0);
          uVar2 = *(undefined8 *)(lVar12 + 0x8c);
          *(undefined8 *)(lVar12 + 0x44) = uVar2;
          uVar1 = *(undefined4 *)(lVar12 + 0x94);
          *(undefined4 *)(lVar12 + 0x4c) = uVar1;
          *(undefined8 *)(lVar12 + 0x38) = uVar2;
          *(undefined4 *)(lVar12 + 0x40) = uVar1;
          *(undefined8 *)(lVar12 + 0x2c) = uVar2;
          *(undefined4 *)(lVar12 + 0x34) = uVar1;
        }
      }
      else {
        fVar18 = *(float *)(t._0_8_ + 0xc) - *(float *)t._0_8_;
        fVar19 = *(float *)(t._0_8_ + 0x18) - *(float *)t._0_8_;
        fVar16 = fVar16 * fVar19 - fVar17 * fVar18;
        if ((fVar16 != 0.0) ||
           (((NAN(fVar16) || (fVar14 = fVar18 * fVar15 - fVar19 * fVar14, fVar14 != 0.0)) ||
            (NAN(fVar14))))) goto LAB_00175bbb;
      }
      if (vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (t._0_8_ != 0) {
        operator_delete((void *)t._0_8_);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmd._M_dataplus._M_p != &cmd.field_2) {
      operator_delete(cmd._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&in);
    std::ios_base::~ios_base(local_340);
  } while( true );
}

Assistant:

std::vector<BasicPrimitive*> loadfromfile(const char* filename)
	{
		console.log("Loading mesh:", filename);
		if (strcmp(filename+strlen(filename)-4, ".obj") != 0)
			throw "format must be obj";
		std::ifstream fin(filename);
		if (!fin)
			throw "Can't open file";
		std::vector<BasicPrimitive*> faces;
		std::vector<vec3f> v,vn;
		std::vector<vec2f> vt;
		std::string line;
		// reading file line by line
		while (std::getline(fin, line)) {
			if (isalpha(line[0])) {
				std::stringstream in(line);
				std::string cmd;
				in >> cmd;
				if (cmd == "v") { // vertex coordinate
					vec3f t;
					in >> t;
					v.push_back(t);
				}
				if (cmd == "vt") { // texture coordinate
					vec2f t;
					in >> t;
					vt.push_back(t);
				}
				if (cmd == "vn") { // normal vector
					vec3f t;
					in >> t;
					vn.push_back(t);
				}
				if (cmd == "f") { // polygon face
					std::vector<vec3f> vv, vvn;
					std::vector<vec2f> vvt;
					bool recompute_normal = false;
					while (!in.fail() && !in.eof()) {					
						// code from tungsten ObjLoader::loadFace
						int indices[] = {0, 0, 0};
						for (int i = 0; i < 3; ++i) {
							if (in.peek() != '/')
								in >> indices[i];
							if (in.peek() == '/')
								in.get();
							else
								break;
						}
						while (isspace(in.peek()))
							in.get();
						if (!indices[0]) {
							console.log("Obj line:", line);
							throw "error parsing obj";
						}
						int iv = indices[0];
						int ivt = indices[1];
						int ivn = indices[2];
						if (iv < 0) iv += v.size()+1;
						if (ivt < 0) ivt += vt.size()+1;
						if (ivn < 0) ivn += vn.size()+1;
						vv.push_back(v[iv-1]);
						vvt.push_back(ivt? vt[ivt-1]: vec2f());
						vvn.push_back(ivn? vn[ivn-1]: vec3f(0,1,0));
						recompute_normal |= !ivn;
					}
					if (vv.size() == 3) {
						// ignore triangles of zero surface area
						if (cross(vv[1]-vv[0],vv[2]-vv[0]) != vec3f(0)) {
							faces.push_back(new Triangle(vv[0], vv[1], vv[2], vvt[0], vvt[1], vvt[2], vvn[0], vvn[1], vvn[2]));
							if (recompute_normal)
								dynamic_cast<Triangle*>(faces.back())->recompute_normal();
						}
					}
					else {
						throw "mesh face other than triangle not supported";
					}
				} // end reading face
			}
		}
		return faces;
	}